

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3PagerClose(Pager *pPager,sqlite3 *db)

{
  u8 *p;
  PgHdr *pPVar1;
  sqlite3_file *psVar2;
  PgHdr *p_00;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  code *pcVar5;
  u8 *zBuf;
  
  p = (u8 *)pPager->pTmpSpace;
  if (sqlite3Hooks_0 != (code *)0x0) {
    (*sqlite3Hooks_0)();
  }
  p_00 = pPager->pMmapFreelist;
  while (p_00 != (PgHdr *)0x0) {
    pPVar1 = p_00->pDirty;
    sqlite3_free(p_00);
    p_00 = pPVar1;
  }
  pPager->exclusiveMode = '\0';
  if ((db == (sqlite3 *)0x0) || ((db->flags & 0x800) != 0)) {
    zBuf = (u8 *)0x0;
  }
  else {
    iVar3 = databaseIsUnmoved(pPager);
    zBuf = (u8 *)0x0;
    if (iVar3 == 0) {
      zBuf = p;
    }
  }
  sqlite3WalClose(pPager->pWal,db,(uint)pPager->walSyncFlags,(int)pPager->pageSize,zBuf);
  pPager->pWal = (Wal *)0x0;
  pager_reset(pPager);
  if (pPager->memDb == '\0') {
    if ((pPager->jfd->pMethods != (sqlite3_io_methods *)0x0) &&
       ((uVar4 = pagerSyncHotJournal(pPager), (char)uVar4 == '\r' || ((uVar4 & 0xff) == 10)))) {
      pPager->errCode = uVar4;
      pPager->eState = '\x06';
      if (uVar4 == 0) {
        if (pPager->bUseFetch == '\0') {
          pcVar5 = getPageNormal;
        }
        else {
          pcVar5 = getPageMMap;
        }
      }
      else {
        pcVar5 = getPageError;
      }
      pPager->xGet = pcVar5;
    }
    pagerUnlockAndRollback(pPager);
  }
  else {
    pager_unlock(pPager);
  }
  if (sqlite3Hooks_1 != (code *)0x0) {
    (*sqlite3Hooks_1)();
  }
  psVar2 = pPager->jfd;
  if (psVar2->pMethods != (sqlite3_io_methods *)0x0) {
    (*psVar2->pMethods->xClose)(psVar2);
    psVar2->pMethods = (sqlite3_io_methods *)0x0;
  }
  psVar2 = pPager->fd;
  if (psVar2->pMethods != (sqlite3_io_methods *)0x0) {
    (*psVar2->pMethods->xClose)(psVar2);
    psVar2->pMethods = (sqlite3_io_methods *)0x0;
  }
  pcache1Free(p);
  (*sqlite3Config.pcache2.xDestroy)(pPager->pPCache->pCache);
  sqlite3_free(pPager);
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerClose(Pager *pPager, sqlite3 *db){
  u8 *pTmp = (u8*)pPager->pTmpSpace;
  assert( db || pagerUseWal(pPager)==0 );
  assert( assert_pager_state(pPager) );
  disable_simulated_io_errors();
  sqlite3BeginBenignMalloc();
  pagerFreeMapHdrs(pPager);
  /* pPager->errCode = 0; */
  pPager->exclusiveMode = 0;
#ifndef SQLITE_OMIT_WAL
  {
    u8 *a = 0;
    assert( db || pPager->pWal==0 );
    if( db && 0==(db->flags & SQLITE_NoCkptOnClose)
     && SQLITE_OK==databaseIsUnmoved(pPager)
    ){
      a = pTmp;
    }
    sqlite3WalClose(pPager->pWal, db, pPager->walSyncFlags, pPager->pageSize,a);
    pPager->pWal = 0;
  }
#endif
  pager_reset(pPager);
  if( MEMDB ){
    pager_unlock(pPager);
  }else{
    /* If it is open, sync the journal file before calling UnlockAndRollback.
    ** If this is not done, then an unsynced portion of the open journal
    ** file may be played back into the database. If a power failure occurs
    ** while this is happening, the database could become corrupt.
    **
    ** If an error occurs while trying to sync the journal, shift the pager
    ** into the ERROR state. This causes UnlockAndRollback to unlock the
    ** database and close the journal file without attempting to roll it
    ** back or finalize it. The next database user will have to do hot-journal
    ** rollback before accessing the database file.
    */
    if( isOpen(pPager->jfd) ){
      pager_error(pPager, pagerSyncHotJournal(pPager));
    }
    pagerUnlockAndRollback(pPager);
  }
  sqlite3EndBenignMalloc();
  enable_simulated_io_errors();
  PAGERTRACE(("CLOSE %d\n", PAGERID(pPager)));
  IOTRACE(("CLOSE %p\n", pPager))
  sqlite3OsClose(pPager->jfd);
  sqlite3OsClose(pPager->fd);
  sqlite3PageFree(pTmp);
  sqlite3PcacheClose(pPager->pPCache);
  assert( !pPager->aSavepoint && !pPager->pInJournal );
  assert( !isOpen(pPager->jfd) && !isOpen(pPager->sjfd) );

  sqlite3_free(pPager);
  return SQLITE_OK;
}